

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void soul::HEARTGenerator::build
               (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules,
               ArrayView<soul::pool_ref<soul::Module>_> targetModules,
               uint32_t maxNestedExpressionDepth)

{
  ModuleBase *source;
  pointer pHVar1;
  pool_ref<soul::AST::ModuleBase> *ppVar2;
  pool_ref<soul::Module> *ppVar3;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  pool_ref<soul::AST::ModuleBase> *ppVar4;
  ulong uVar5;
  long lVar6;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  pool_ref<soul::AST::ModuleBase> *ppVar7;
  pool_ref<soul::AST::ModuleBase> *__end2;
  vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> generators;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_e8;
  ArrayView<soul::pool_ref<soul::Module>_> local_d8;
  vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> local_c8;
  HEARTGenerator local_b0;
  
  ppVar4 = sourceModules.e;
  local_d8.e = targetModules.e;
  local_d8.s = targetModules.s;
  ppVar2 = sourceModules.s;
  local_e8.s = ppVar2;
  local_e8.e = ppVar4;
  for (ppVar7 = ppVar2; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    SanityCheckPass::runPreHEARTGenChecks(ppVar7->object);
  }
  local_c8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar5 = 0; uVar5 < (ulong)((long)ppVar4 - (long)ppVar2 >> 3); uVar5 = uVar5 + 1) {
    ppVar2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[](&local_e8,uVar5);
    source = ppVar2->object;
    ppVar3 = ArrayView<soul::pool_ref<soul::Module>_>::operator[](&local_d8,uVar5);
    HEARTGenerator(&local_b0,source,ppVar3->object,maxNestedExpressionDepth);
    std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::
    emplace_back<soul::HEARTGenerator>(&local_c8,&local_b0);
    ~HEARTGenerator(&local_b0);
    ppVar2 = local_e8.s;
    ppVar4 = local_e8.e;
  }
  lVar6 = 0;
  for (uVar5 = 0;
      pHVar1 = local_c8.
               super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)ppVar4 - (long)ppVar2 >> 3); uVar5 = uVar5 + 1) {
    ppVar2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[](&local_e8,uVar5);
    (**(code **)(*(long *)((long)&(pHVar1->super_ASTVisitor)._vptr_ASTVisitor + lVar6) + 0x10))
              ((long)&(pHVar1->super_ASTVisitor)._vptr_ASTVisitor + lVar6,ppVar2->object);
    lVar6 = lVar6 + 0x80;
    ppVar2 = local_e8.s;
    ppVar4 = local_e8.e;
  }
  std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::~vector(&local_c8);
  return;
}

Assistant:

static void build (ArrayView<pool_ref<AST::ModuleBase>> sourceModules,
                       ArrayView<pool_ref<Module>> targetModules,
                       uint32_t maxNestedExpressionDepth = 255)
    {
        for (auto& m : sourceModules)
            SanityCheckPass::runPreHEARTGenChecks (m);

        std::vector<HEARTGenerator> generators;

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators.push_back ({ sourceModules[i], targetModules[i], maxNestedExpressionDepth });

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators[i].visitObject (sourceModules[i]);
    }